

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# penguinv.cpp
# Opt level: O0

void penguinV::Threshold(Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut
                        ,uint32_t startYOut,uint32_t width,uint32_t height,uint8_t threshold)

{
  ThresholdForm4 p_Var1;
  bool bVar2;
  ImageTypeManager *this;
  FunctionTableHolder *pFVar3;
  ImageManager *this_00;
  Image *pIVar4;
  uint32_t in_EDX;
  uint32_t in_ESI;
  ImageTemplate<unsigned_char> *in_RDI;
  uint32_t in_R8D;
  uint32_t in_R9D;
  uint32_t in_stack_00000008;
  uint32_t in_stack_00000010;
  uint8_t in_stack_00000018;
  ImageManager manager;
  ThresholdForm4 funcTemp;
  const_iterator type;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *types;
  uint8_t imageType;
  ThresholdForm4 func;
  ImageTypeManager *registrator;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  uint8_t requiredType;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  ImageTypeManager *in_stack_fffffffffffffee8;
  ImageTypeManager *pIVar5;
  FunctionTableHolder *in_stack_fffffffffffffef0;
  ImageTypeManager *this_01;
  Image *in_stack_ffffffffffffff10;
  ImageManager *in_stack_ffffffffffffff18;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_70;
  char *in_stack_ffffffffffffff98;
  _func_void_ImageTemplate<unsigned_char>_ptr_uint_uint_ImageTemplate<unsigned_char>_ptr_uint_uint_uint_uint_uchar
  *in_stack_ffffffffffffffa0;
  ThresholdForm4 local_40;
  
  this = ImageTypeManager::instance();
  this_01 = this;
  PenguinV_Image::ImageTemplate<unsigned_char>::type(in_RDI);
  pFVar3 = ImageTypeManager::functionTable
                     ((ImageTypeManager *)in_stack_fffffffffffffef0,
                      (uint8_t)((ulong)in_stack_fffffffffffffee8 >> 0x38));
  local_40 = pFVar3->Threshold;
  PenguinV_Image::ImageTemplate<unsigned_char>::type(in_RDI);
  if ((local_40 == (ThresholdForm4)0x0) &&
     (bVar2 = ImageTypeManager::isIntertypeConversionEnabled(this), bVar2)) {
    ImageTypeManager::imageTypes(in_stack_fffffffffffffee8);
    local_70._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::cbegin
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    while( true ) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::cend
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                         (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      if (!bVar2) break;
      pIVar5 = this;
      __gnu_cxx::
      __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator*(&local_70);
      in_stack_fffffffffffffef0 =
           ImageTypeManager::functionTable
                     ((ImageTypeManager *)in_stack_fffffffffffffef0,(uint8_t)((ulong)pIVar5 >> 0x38)
                     );
      p_Var1 = in_stack_fffffffffffffef0->Threshold;
      if (p_Var1 != (ThresholdForm4)0x0) {
        __gnu_cxx::
        __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::operator*(&local_70);
        local_40 = p_Var1;
        break;
      }
      __gnu_cxx::
      __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator++(&local_70);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  }
  requiredType = (uint8_t)((uint)in_stack_fffffffffffffeac >> 0x18);
  (anonymous_namespace)::
  verifyFunction<void(*)(PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,PenguinV_Image::ImageTemplate<unsigned_char>&,unsigned_int,unsigned_int,unsigned_int,unsigned_int,unsigned_char)>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  anon_unknown.dwarf_353bb::ImageManager::ImageManager
            ((ImageManager *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
             requiredType);
  this_00 = (ImageManager *)
            anon_unknown.dwarf_353bb::ImageManager::operator()
                      ((ImageManager *)this_01,(Image *)in_stack_fffffffffffffef0);
  pIVar4 = anon_unknown.dwarf_353bb::ImageManager::operator()
                     (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  (*local_40)((Image *)this_00,in_ESI,in_EDX,pIVar4,in_R8D,in_R9D,in_stack_00000008,
              in_stack_00000010,in_stack_00000018);
  anon_unknown.dwarf_353bb::ImageManager::~ImageManager(this_00);
  return;
}

Assistant:

void Threshold( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
                    uint32_t width, uint32_t height, uint8_t threshold )
    {
        initialize( in, Threshold )
        func( manager(in), startXIn, startYIn, manager(out), startXOut, startYOut, width, height, threshold );
    }